

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

void hashTableDestroy(HASH_TABLE *table)

{
  ulong uVar1;
  
  if (table->size != 0) {
    uVar1 = 0;
    do {
      if (table->v[uVar1] != (NAMED *)0x0) {
        (*table->mem->free_fcn)(table->v[uVar1]);
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < table->size);
  }
  if (table->v != (NAMED **)0x0) {
    (*table->mem->free_fcn)(table->v);
    return;
  }
  return;
}

Assistant:

static
void hashTableDestroy(HASH_TABLE *table)
{
  size_t i;
  for (i = 0; i < table->size; i++) {
    NAMED *p = table->v[i];
    if (p)
      table->mem->free_fcn(p);
  }
  if (table->v)
    table->mem->free_fcn(table->v);
}